

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint32_t num;
  char str [50];
  uint32_t local_6c;
  char local_68 [56];
  
  printf("Please input a number: ");
  pcVar2 = fgets(local_68,0x32,_stdin);
  if (pcVar2 != (char *)0x0) {
    do {
      iVar1 = __isoc99_sscanf(local_68,"%u",&local_6c);
      if (iVar1 != 0) {
        decompose(local_6c);
        return 0;
      }
      puts("Invalid number!");
      printf("Please input a number: ");
      pcVar2 = fgets(local_68,0x32,_stdin);
    } while (pcVar2 != (char *)0x0);
  }
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  uint32_t num;

  while (true) {
    printf("Please input a number: ");
    char str[50];
    if (fgets(str, 50, stdin) == NULL) {
      printf("\n");
      return 0;
    }
    if (sscanf(str, "%" SCNu32, &num)) break;
    else printf("Invalid number!\n");
  }

  decompose(num);
}